

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O3

void us_poll_stop(us_poll_t *p,us_loop_t *loop)

{
  int iVar1;
  long lVar2;
  epoll_data_t *peVar3;
  epoll_event event;
  
  epoll_ctl(loop->fd,2,((int)p->state << 4) >> 4,(epoll_event *)&stack0xffffffffffffffe4);
  iVar1 = loop->current_ready_poll;
  if (iVar1 < loop->num_ready_polls) {
    lVar2 = (long)loop->num_ready_polls - (long)iVar1;
    peVar3 = &loop->ready_polls[iVar1].data;
    do {
      if ((us_poll_t *)peVar3->ptr == p) {
        peVar3->ptr = (void *)0x0;
        return;
      }
      peVar3 = (epoll_data_t *)((long)peVar3 + 0xc);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void us_poll_stop(struct us_poll_t *p, struct us_loop_t *loop) {
    int old_events = us_poll_events(p);
    int new_events = 0;
#ifdef LIBUS_USE_EPOLL
    struct epoll_event event;
    epoll_ctl(loop->fd, EPOLL_CTL_DEL, p->state.fd, &event);
#else
    if (old_events) {
        kqueue_change(loop->fd, p->state.fd, old_events, new_events, NULL);
    }
#endif

    /* Disable any instance of us in the pending ready poll list */
    us_internal_loop_update_pending_ready_polls(loop, p, 0, old_events, new_events);
}